

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pltcalc.cpp
# Opt level: O1

void pltcalc::getintervals(void)

{
  FILE *__stream;
  size_t sVar1;
  mapped_type *pmVar2;
  float fVar3;
  float q;
  float local_3c;
  undefined1 local_38 [16];
  
  __stream = fopen("input/quantile.bin","rb");
  if (__stream != (FILE *)0x0) {
    sVar1 = fread(&local_3c,4,1,__stream);
    if (sVar1 != 0) {
      do {
        fVar3 = (float)(samplesize_ + -1) * local_3c + 1.0;
        local_38 = ZEXT416((uint)(fVar3 - (float)(int)fVar3));
        pmVar2 = std::
                 map<float,_interval,_std::less<float>,_std::allocator<std::pair<const_float,_interval>_>_>
                 ::operator[]((map<float,_interval,_std::less<float>,_std::allocator<std::pair<const_float,_interval>_>_>
                               *)intervals_,&local_3c);
        pmVar2->integer_part = (int)fVar3;
        pmVar2->fractional_part = (float)local_38._0_4_;
        sVar1 = fread(&local_3c,4,1,__stream);
      } while (sVar1 != 0);
    }
    fclose(__stream);
    return;
  }
  getintervals();
}

Assistant:

void getintervals()
	{

		FILE * fin = fopen(QUANTILE_FILE, "rb");
		if (fin == NULL) {
			fprintf(stderr, "FATAL: %s: Error opening file %s\n",
				__func__, QUANTILE_FILE);
			exit(EXIT_FAILURE);
		}

		float q;
		size_t i = fread(&q, sizeof(q), 1, fin);
		while (i != 0) {
			interval idx;
			float pos = (samplesize_ - 1) * q + 1;
			idx.integer_part = (int)pos;
			idx.fractional_part = pos - idx.integer_part;
			intervals_[q] = idx;
			i = fread(&q, sizeof(q), 1, fin);
		}

		fclose(fin);

	}